

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makePreview.cpp
# Opt level: O0

double anon_unknown.dwarf_41ee::gamma(double param_1)

{
  float *pfVar1;
  float fVar2;
  double dVar3;
  undefined4 extraout_XMM0_Db;
  float x;
  float local_14;
  uint in_stack_fffffffffffffff4;
  
  local_14 = Imath_3_2::half::operator_cast_to_float
                       ((half *)((ulong)in_stack_fffffffffffffff4 << 0x20));
  local_14 = local_14 * SUB84(param_1,0);
  pfVar1 = std::max<float>((float *)&stack0xfffffffffffffff0,&local_14);
  fVar2 = *pfVar1;
  if (1.0 < fVar2) {
    fVar2 = knee(0.0,1.48898e-39);
    fVar2 = fVar2 + 1.0;
  }
  dVar3 = std::pow((double)(ulong)(uint)fVar2,5.21455598321582e-315);
  fVar2 = Imath_3_2::clamp<float>(SUB84(dVar3,0) * 84.66,0.0,255.0);
  return (double)CONCAT44(extraout_XMM0_Db,fVar2);
}

Assistant:

unsigned char
gamma (half h, float m)
{
    //
    // Conversion from half to unsigned char pixel data,
    // with gamma correction.  The conversion is the same
    // as in the exrdisplay program's ImageView class,
    // except with defog, kneeLow, and kneeHigh fixed
    // at 0.0, 0.0, and 5.0 respectively.
    //

    float x = max (0.f, h * m);

    if (x > 1) x = 1 + knee (x - 1, 0.184874f);

    return (unsigned char) (IMATH_NAMESPACE::clamp (
        std::pow (x, 0.4545f) * 84.66f, 0.f, 255.f));
}